

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintTools.h
# Opt level: O2

void PrintTools::PrintVectorCout<unsigned_int>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  pointer puVar1;
  ostream *poVar2;
  pointer puVar3;
  stringstream ss;
  string local_380 [32];
  string local_360 [32];
  stringstream local_340 [16];
  ostream local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_340);
  puVar3 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::operator<<(local_330,"< ");
  for (; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    if (puVar3 != (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start) {
      std::operator<<(local_330,", ");
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::operator<<(local_330,local_360);
    std::__cxx11::string::~string(local_360);
  }
  std::operator<<(local_330," >");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  poVar2 = std::operator<<((ostream *)&std::cout,local_380);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(local_380);
  return;
}

Assistant:

static void PrintVectorCout(const std::vector<T> &v)
{
    std::cout << SoftPrintVector(v) << std::endl;
}